

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_merge_inplace(char *file1,char *file2)

{
  long lVar1;
  int iVar2;
  int iVar3;
  mcpl_file_t nparticles;
  mcpl_file_t mVar4;
  FILE *f1a;
  uint64_t first_particle_pos;
  uint particle_size;
  uint64_t np2;
  uint64_t np1;
  mcpl_fileinternal_t *f2;
  mcpl_fileinternal_t *f1;
  int can_merge;
  mcpl_file_t ff2;
  mcpl_file_t ff1;
  mcu8str file2_str;
  mcu8str file1_str;
  mcu8str *in_stack_00001100;
  mcu8str *in_stack_00001108;
  char *in_stack_ffffffffffffff68;
  mcpl_file_t in_stack_ffffffffffffff70;
  char *mode;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  mcpl_file_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa8;
  mcpl_file_t mVar6;
  
  mcu8str_view_cstr((char *)in_stack_ffffffffffffff70.internal);
  mcu8str_view_cstr((char *)in_stack_ffffffffffffff70.internal);
  iVar2 = mctools_is_same_file(in_stack_00001108,in_stack_00001100);
  if (iVar2 != 0) {
    mcpl_error((char *)0x106b0b);
  }
  nparticles = mcpl_open_file(in_stack_ffffffffffffff68);
  mVar4 = mcpl_open_file(in_stack_ffffffffffffff68);
  mVar6.internal._4_4_ = in_stack_ffffffffffffff84;
  mVar6.internal._0_4_ = in_stack_ffffffffffffff80;
  iVar2 = mcpl_actual_can_merge(in_stack_ffffffffffffff88,mVar6);
  if (iVar2 == 0) {
    mcpl_close_file(in_stack_ffffffffffffff70);
    mcpl_close_file(in_stack_ffffffffffffff70);
    mcpl_error((char *)0x106b69);
  }
  mVar6.internal = mVar4.internal;
  if (*(int *)((long)nparticles.internal + 0x18) != *(int *)((long)mVar4.internal + 0x18)) {
    mcpl_close_file(in_stack_ffffffffffffff70);
    mcpl_close_file(in_stack_ffffffffffffff70);
    mcpl_error((char *)0x106baf);
  }
  if (*(long *)((long)nparticles.internal + 8) != 0) {
    mcpl_close_file(in_stack_ffffffffffffff70);
    mcpl_close_file(in_stack_ffffffffffffff70);
    mcpl_error((char *)0x106bdb);
  }
  lVar1 = *(long *)((long)nparticles.internal + 0x40);
  if (*(long *)((long)mVar4.internal + 0x40) == 0) {
    mcpl_close_file(in_stack_ffffffffffffff70);
    mcpl_close_file(in_stack_ffffffffffffff70);
  }
  else {
    uVar5 = *(uint *)((long)nparticles.internal + 0x78);
    mode = *(char **)((long)nparticles.internal + 0x80);
    if ((uVar5 != *(uint *)((long)mVar4.internal + 0x78)) ||
       (mode != *(char **)((long)mVar4.internal + 0x80))) {
      mcpl_error((char *)0x106c62);
    }
    mcpl_close_file(in_stack_ffffffffffffff70);
    mVar4.internal = mcpl_internal_fopen((char *)CONCAT44(uVar5,in_stack_ffffffffffffff80),mode);
    if ((FILE *)mVar4.internal == (FILE *)0x0) {
      mcpl_close_file((mcpl_file_t)0x0);
      mcpl_error((char *)0x106ca3);
    }
    iVar3 = fseek((FILE *)mVar4.internal,(long)(mode + (ulong)uVar5 * lVar1),0);
    if (iVar3 != 0) {
      mcpl_close_file(mVar4);
      fclose((FILE *)mVar4.internal);
      mcpl_error((char *)0x106ce6);
    }
    mcpl_update_nparticles((FILE *)CONCAT44(uVar5,in_stack_ffffffffffffff80),(uint64_t)mode);
    mcpl_transfer_particle_contents
              ((FILE *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),mVar6,(uint64_t)nparticles.internal
              );
    mcpl_update_nparticles((FILE *)CONCAT44(uVar5,in_stack_ffffffffffffff80),(uint64_t)mode);
    mcpl_close_file(mVar4);
    fclose((FILE *)mVar4.internal);
  }
  return;
}

Assistant:

void mcpl_merge_inplace(const char * file1, const char* file2)
{
  {
    mcu8str file1_str = mcu8str_view_cstr( file1 );
    mcu8str file2_str = mcu8str_view_cstr( file2 );
    if ( mctools_is_same_file(&file1_str, &file2_str) )
      mcpl_error("Merging file with itself");
  }

  mcpl_file_t ff1 = mcpl_open_file(file1);
  mcpl_file_t ff2 = mcpl_open_file(file2);
  int can_merge = mcpl_actual_can_merge(ff1,ff2);
  if (!can_merge) {
    mcpl_close_file(ff1);
    mcpl_close_file(ff2);
    mcpl_error("Attempting to merge incompatible files");
  }

  //Access internals:
  mcpl_fileinternal_t * f1 = (mcpl_fileinternal_t *)ff1.internal;
  mcpl_fileinternal_t * f2 = (mcpl_fileinternal_t *)ff2.internal;
  assert(f1);
  assert(f2);

  if (f1->format_version!=f2->format_version) {
    mcpl_close_file(ff1);
    mcpl_close_file(ff2);
    mcpl_error("Attempting to merge incompatible files (can not mix"
               " MCPL format versions when merging inplace)");
  }

  if (f1->filegz) {
    mcpl_close_file(ff1);
    mcpl_close_file(ff2);
    mcpl_error("direct modification of gzipped files is not supported.");
  }

  uint64_t np1 = f1->nparticles;
  uint64_t np2 = f2->nparticles;
  if (!np2) {
    //nothing to take from file 2.
    mcpl_close_file(ff1);
    mcpl_close_file(ff2);
    return;
  }

  unsigned particle_size = f1->particle_size;
  uint64_t first_particle_pos = f1->first_particle_pos;

  //Should be same since can_merge:
  if ( particle_size != f2->particle_size
       || first_particle_pos != f2->first_particle_pos )
    mcpl_error("mcpl_merge_inplace: unexpected particle size or position");

  //Now, close file1 and reopen a file handle in append mode:
  mcpl_close_file(ff1);
  FILE * f1a = mcpl_internal_fopen(file1,"r+b");

  //Update file positions. Note that f2->file is already at the position for the
  //first particle and that the seek operation on f1a correctly discards any
  //partial entries at the end, which could be there if the file was in need of
  //mcpl_repair:
  if (!f1a) {
    mcpl_close_file(ff2);
    mcpl_error("Unable to open file1 in update mode!");
  }
  if (MCPL_FSEEK( f1a, first_particle_pos + particle_size*np1 )) {
    mcpl_close_file(ff2);
    fclose(f1a);
    mcpl_error("Unable to seek to end of file1 in update mode");
  }

  //Transfer particle contents, setting nparticles to 0 during the operation (so
  //the file appears broken and in need of mcpl_repair in case of errors during
  //the transfer):
  mcpl_update_nparticles(f1a,0);
  mcpl_transfer_particle_contents(f1a, ff2, np2);
  mcpl_update_nparticles(f1a,np1+np2);

  //Finish up.
  mcpl_close_file(ff2);
  fclose(f1a);
}